

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<13,_5,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  Type in0;
  undefined1 local_74 [20];
  float local_60;
  float local_5c;
  Vector<float,_3> local_58;
  tcu local_4c [12];
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  VecAccess<float,_4,_3> local_30;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,5>
              ((ShaderEvalContext *)local_74,(int)evalCtx);
  }
  else {
    tcu::Matrix<float,_2,_2>::Matrix
              ((Matrix<float,_2,_2> *)local_74,(float *)sr::(anonymous_namespace)::s_constInMat2x2);
  }
  local_58.m_data[2] = (float)local_74._4_4_ + (float)local_74._12_4_;
  local_58.m_data[0] = (float)local_74._0_4_;
  local_58.m_data[1] = (float)local_74._8_4_;
  sr::(anonymous_namespace)::MatrixCaseUtils::increment<float,2,2>
            ((MatrixCaseUtils *)&local_40,(Matrix<float,_2,_2> *)local_74);
  local_5c = local_3c + local_34;
  local_74._16_4_ = local_40;
  local_60 = local_38;
  tcu::operator+(local_4c,&local_58,(Vector<float,_3> *)(local_74 + 0x10));
  local_30.m_vector = &evalCtx->color;
  local_30.m_index[0] = 0;
  local_30.m_index[1] = 1;
  local_30.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_30,(Vector<float,_3> *)local_4c);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(in0) + reduceToVec3(increment(in0));
	}